

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O3

void __thiscall aalcalc::getmaxsummaryid(aalcalc *this,string *path)

{
  pointer pcVar1;
  _Base_ptr **ppp_Var2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  undefined8 extraout_RAX;
  string filename;
  char line [4096];
  aalcalc local_1038 [6];
  
  ppp_Var2 = (_Base_ptr **)((long)local_1038 + 0x10);
  pcVar1 = (path->_M_dataplus)._M_p;
  local_1038[0].summary_id_to_event_offset_._M_t._M_impl._0_8_ = ppp_Var2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1038,pcVar1,pcVar1 + path->_M_string_length);
  std::__cxx11::string::append((char *)local_1038);
  __stream = fopen((char *)local_1038[0].summary_id_to_event_offset_._M_t._M_impl._0_8_,"rb");
  if (__stream != (FILE *)0x0) {
    pcVar4 = fgets((char *)((long)local_1038 + 0x20),0x1000,__stream);
    if (pcVar4 != (char *)0x0) {
      iVar3 = __isoc99_sscanf((_Base_ptr **)((long)local_1038 + 0x20),"%d",&this->max_summary_id_);
      if (iVar3 != 1) goto LAB_00103d97;
    }
    fclose(__stream);
    if ((_Base_ptr **)local_1038[0].summary_id_to_event_offset_._M_t._M_impl._0_8_ != ppp_Var2) {
      operator_delete((void *)local_1038[0].summary_id_to_event_offset_._M_t._M_impl._0_8_);
    }
    return;
  }
  getmaxsummaryid(local_1038);
LAB_00103d97:
  getmaxsummaryid();
  if ((_Base_ptr **)local_1038[0].summary_id_to_event_offset_._M_t._M_impl._0_8_ != ppp_Var2) {
    operator_delete((void *)local_1038[0].summary_id_to_event_offset_._M_t._M_impl._0_8_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void aalcalc::getmaxsummaryid(std::string &path)
{
	std::string filename = path + "max_summary_id.idx";
	FILE *fin = fopen(filename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}

	char line[4096];
	if (fgets(line, sizeof(line), fin) != 0)
	{
		int ret = sscanf(line, "%d", &max_summary_id_);
		if (ret != 1) {
			fprintf(stderr, "FATAL:Invalid data in line %d:\n%s %d", 1, line, ret);
			exit(-1);
		}		
	}

	fclose(fin);
}